

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPolyhedralConvexShape.cpp
# Opt level: O3

cbtVector3 __thiscall
cbtPolyhedralConvexShape::localGetSupportingVertexWithoutMargin
          (cbtPolyhedralConvexShape *this,cbtVector3 *vec0)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  ulong *puVar7;
  int i;
  ulong uVar8;
  undefined8 *puVar9;
  ulong uVar10;
  cbtScalar maxDot1;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [64];
  float fVar14;
  cbtVector3 cVar15;
  cbtVector3 temp [128];
  float local_864;
  float local_860;
  float local_85c;
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined8 local_838;
  ulong local_830 [256];
  
  local_864 = vec0->m_floats[1];
  local_860 = vec0->m_floats[0];
  fVar11 = vec0->m_floats[2];
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(local_864 * local_864)),ZEXT416((uint)local_860),
                           ZEXT416((uint)local_860));
  auVar1 = vfmadd231ss_fma(auVar1,ZEXT416((uint)fVar11),ZEXT416((uint)fVar11));
  if (0.0001 <= auVar1._0_4_) {
    auVar1 = vsqrtss_avx(auVar1,auVar1);
    fVar14 = 1.0 / auVar1._0_4_;
    local_860 = local_860 * fVar14;
    local_864 = local_864 * fVar14;
    fVar11 = fVar11 * fVar14;
  }
  else {
    local_864 = 0.0;
    local_860 = 1.0;
    fVar11 = 0.0;
  }
  iVar3 = (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
            _vptr_cbtCollisionShape[0x19])(this);
  if (iVar3 < 1) {
    local_858._0_8_ = 0;
    local_848._0_8_ = 0;
  }
  else {
    local_848 = ZEXT816(0);
    iVar3 = 0;
    local_85c = -1e+18;
    local_858._0_12_ = ZEXT812(0);
    local_858._12_4_ = 0;
    do {
      iVar4 = (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
                _vptr_cbtCollisionShape[0x19])(this);
      uVar5 = 0x80;
      if (iVar4 - iVar3 < 0x80) {
        iVar4 = (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
                  _vptr_cbtCollisionShape[0x19])(this);
        uVar5 = iVar4 - iVar3;
        if (uVar5 != 0 && iVar3 <= iVar4) goto LAB_008d2073;
        fVar12 = -3.4028235e+38;
        lVar6 = -1;
      }
      else {
LAB_008d2073:
        uVar10 = 0;
        puVar9 = &local_838;
        do {
          (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
            _vptr_cbtCollisionShape[0x1c])(this,uVar10 & 0xffffffff,puVar9);
          uVar10 = uVar10 + 1;
          puVar9 = puVar9 + 2;
        } while (uVar5 != uVar10);
        auVar13 = ZEXT464(0xff7fffff);
        uVar10 = 0xffffffff;
        puVar7 = local_830;
        uVar8 = 0;
        do {
          auVar1 = vfmadd231ss_fma(ZEXT416((uint)(local_864 * *(float *)((long)puVar7 + -4))),
                                   ZEXT416((uint)local_860),ZEXT416((uint)puVar7[-1]));
          auVar2 = vfmadd231ss_fma(auVar1,ZEXT416((uint)fVar11),ZEXT416((uint)*puVar7));
          fVar14 = auVar13._0_4_;
          auVar1 = vmaxss_avx(auVar2,auVar13._0_16_);
          auVar13 = ZEXT1664(auVar1);
          fVar12 = auVar1._0_4_;
          if (fVar14 < auVar2._0_4_) {
            uVar10 = uVar8 & 0xffffffff;
          }
          uVar8 = uVar8 + 1;
          puVar7 = puVar7 + 2;
        } while (uVar5 != uVar8);
        lVar6 = (long)(int)uVar10;
      }
      if (local_85c < fVar12) {
        local_858._8_8_ = 0;
        local_858._0_8_ = (&local_838)[lVar6 * 2];
        local_848._8_8_ = 0;
        local_848._0_8_ = local_830[lVar6 * 2];
        local_85c = fVar12;
      }
      iVar3 = iVar3 + 0x80;
      iVar4 = (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
                _vptr_cbtCollisionShape[0x19])(this);
    } while (iVar3 < iVar4);
  }
  cVar15.m_floats[2] = (cbtScalar)local_848._0_4_;
  cVar15.m_floats[3] = (cbtScalar)local_848._4_4_;
  cVar15.m_floats[0] = (cbtScalar)local_858._0_4_;
  cVar15.m_floats[1] = (cbtScalar)local_858._4_4_;
  return (cbtVector3)cVar15.m_floats;
}

Assistant:

cbtVector3 cbtPolyhedralConvexShape::localGetSupportingVertexWithoutMargin(const cbtVector3& vec0) const
{
	cbtVector3 supVec(0, 0, 0);
#ifndef __SPU__
	int i;
	cbtScalar maxDot(cbtScalar(-BT_LARGE_FLOAT));

	cbtVector3 vec = vec0;
	cbtScalar lenSqr = vec.length2();
	if (lenSqr < cbtScalar(0.0001))
	{
		vec.setValue(1, 0, 0);
	}
	else
	{
		cbtScalar rlen = cbtScalar(1.) / cbtSqrt(lenSqr);
		vec *= rlen;
	}

	cbtVector3 vtx;
	cbtScalar newDot;

	for (int k = 0; k < getNumVertices(); k += 128)
	{
		cbtVector3 temp[128];
		int inner_count = MIN(getNumVertices() - k, 128);
		for (i = 0; i < inner_count; i++)
			getVertex(i, temp[i]);
		i = (int)vec.maxDot(temp, inner_count, newDot);
		if (newDot > maxDot)
		{
			maxDot = newDot;
			supVec = temp[i];
		}
	}

#endif  //__SPU__
	return supVec;
}